

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStrategy.cpp
# Opt level: O0

set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_> * __thiscall
SimpleStrategy::matchCalls
          (set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_>
           *__return_storage_ptr__,SimpleStrategy *this,
          set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_> *a,
          set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_> *b)

{
  bool bVar1;
  reference pCVar2;
  reference puVar3;
  size_type sVar4;
  _Self local_160;
  _Self local_158;
  iterator it2B;
  _Self local_148;
  iterator it2A;
  Call newCall;
  undefined1 local_e0 [8];
  Call callB;
  _Self local_98;
  iterator itB;
  undefined1 local_80 [8];
  Call callA;
  _Self local_38;
  iterator itA;
  set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_> *b_local;
  set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_> *a_local;
  SimpleStrategy *this_local;
  set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_> *match;
  
  itA._M_node._7_1_ = 0;
  std::set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_>::set
            (__return_storage_ptr__);
  local_38._M_node =
       (_Base_ptr)
       std::set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_>::begin(a);
  while( true ) {
    callA.calls._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)std::set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_>::
                 end(a);
    bVar1 = std::operator!=(&local_38,
                            (_Self *)&callA.calls._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (!bVar1) break;
    pCVar2 = std::_Rb_tree_const_iterator<CfgData::Call>::operator*(&local_38);
    CfgData::Call::Call((Call *)local_80,pCVar2);
    local_98._M_node =
         (_Base_ptr)
         std::set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_>::find
                   (b,(key_type *)local_80);
    callB.calls._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)std::set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_>::
                 end(b);
    bVar1 = std::operator!=(&local_98,
                            (_Self *)&callB.calls._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (bVar1) {
      pCVar2 = std::_Rb_tree_const_iterator<CfgData::Call>::operator*(&local_98);
      CfgData::Call::Call((Call *)local_e0,pCVar2);
      local_38._M_node =
           (_Base_ptr)
           std::set<CfgData::Call,std::less<CfgData::Call>,std::allocator<CfgData::Call>>::
           erase_abi_cxx11_((set<CfgData::Call,std::less<CfgData::Call>,std::allocator<CfgData::Call>>
                             *)a,local_38._M_node);
      newCall.calls._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_98._M_node;
      local_98._M_node =
           (_Base_ptr)
           std::set<CfgData::Call,std::less<CfgData::Call>,std::allocator<CfgData::Call>>::
           erase_abi_cxx11_((set<CfgData::Call,std::less<CfgData::Call>,std::allocator<CfgData::Call>>
                             *)b,local_98._M_node);
      CfgData::Call::Call((Call *)&it2A,(Addr)callA._vptr_Call);
      local_148._M_node =
           (_Base_ptr)
           std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::begin
                     ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)&callA.block_addr);
      while( true ) {
        it2B = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
               end((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                   &callA.block_addr);
        bVar1 = std::operator!=(&local_148,&it2B);
        if (!bVar1) break;
        puVar3 = std::_Rb_tree_const_iterator<unsigned_long>::operator*(&local_148);
        local_158._M_node =
             (_Base_ptr)
             std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::find
                       ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)&callB.block_addr,puVar3);
        local_160._M_node =
             (_Base_ptr)
             std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::end
                       ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)&callB.block_addr);
        bVar1 = std::operator!=(&local_158,&local_160);
        if (bVar1) {
          std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>::
          erase_abi_cxx11_((set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>
                            *)&callB.block_addr,(const_iterator)local_158._M_node);
          puVar3 = std::_Rb_tree_const_iterator<unsigned_long>::operator*(&local_148);
          std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::insert
                    ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *
                     )&newCall.block_addr,puVar3);
          local_148._M_node =
               (_Base_ptr)
               std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>::
               erase_abi_cxx11_((set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>
                                 *)&callA.block_addr,local_148._M_node);
        }
        else {
          std::_Rb_tree_const_iterator<unsigned_long>::operator++(&local_148,0);
        }
      }
      sVar4 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
              size((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                   &newCall.block_addr);
      if (sVar4 != 0) {
        std::set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_>::insert
                  (__return_storage_ptr__,(value_type *)&it2A);
      }
      bVar1 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
              empty((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                    &callA.block_addr);
      if (!bVar1) {
        std::set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_>::insert
                  (a,(value_type *)local_80);
      }
      bVar1 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
              empty((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                    &callB.block_addr);
      if (!bVar1) {
        std::set<CfgData::Call,_std::less<CfgData::Call>,_std::allocator<CfgData::Call>_>::insert
                  (b,(value_type *)local_e0);
      }
      CfgData::Call::~Call((Call *)&it2A);
      CfgData::Call::~Call((Call *)local_e0);
    }
    else {
      std::_Rb_tree_const_iterator<CfgData::Call>::operator++(&local_38,0);
    }
    CfgData::Call::~Call((Call *)local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<CfgData::Call> SimpleStrategy::matchCalls(std::set<CfgData::Call>& a, std::set<CfgData::Call>& b) {
	std::set<CfgData::Call> match;

	std::set<CfgData::Call>::iterator itA = a.begin();
	while (itA != a.end()) {
		CfgData::Call callA = *itA;

		std::set<CfgData::Call>::iterator itB = b.find(callA);
		if (itB != b.end()) {
			CfgData::Call callB = *itB;

			// Always remove, it may be added again later.
			itA = a.erase(itA);
			itB = b.erase(itB);

			CfgData::Call newCall(callA.block_addr);

			std::set<Addr>::iterator it2A = callA.calls.begin();
			while (it2A != callA.calls.end()) {
				std::set<Addr>::iterator it2B = callB.calls.find(*it2A);
				if (it2B != callB.calls.end()) {
					callB.calls.erase(it2B);

					newCall.calls.insert(*it2A);
					it2A = callA.calls.erase(it2A);
				} else {
					it2A++;
				}
			}

			if (newCall.calls.size() > 0)
				match.insert(newCall);

			// If it still has at least one call, add it back.
			if (!callA.calls.empty())
				a.insert(callA);
			if (!callB.calls.empty())
				b.insert(callB);
		} else {
			itA++;
		}
	}

	return match;
}